

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O1

size_t luaZ_read(ZIO *z,void *b,size_t n)

{
  bool bVar1;
  int iVar2;
  size_t unaff_R12;
  ulong __n;
  
  do {
    if (n == 0) {
      return 0;
    }
    if (z->n == 0) {
      iVar2 = luaZ_fill(z);
      if (iVar2 != -1) {
        z->n = z->n + 1;
        z->p = z->p + -1;
        goto LAB_001589f3;
      }
      bVar1 = false;
      unaff_R12 = n;
    }
    else {
LAB_001589f3:
      __n = z->n;
      if (n < z->n) {
        __n = n;
      }
      memcpy(b,z->p,__n);
      z->n = z->n - __n;
      z->p = z->p + __n;
      b = (void *)((long)b + __n);
      n = n - __n;
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_R12;
    }
  } while( true );
}

Assistant:

size_t luaZ_read (ZIO *z, void *b, size_t n) {
  while (n) {
    size_t m;
    if (z->n == 0) {  /* no bytes in buffer? */
      if (luaZ_fill(z) == EOZ)  /* try to read more */
        return n;  /* no more input; return number of missing bytes */
      else {
        z->n++;  /* luaZ_fill consumed first byte; put it back */
        z->p--;
      }
    }
    m = (n <= z->n) ? n : z->n;  /* min. between n and z->n */
    memcpy(b, z->p, m);
    z->n -= m;
    z->p += m;
    b = (char *)b + m;
    n -= m;
  }
  return 0;
}